

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

void __thiscall
llvm::
DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
::copyFrom(DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
           *this,DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
                 *other)

{
  uint uVar1;
  DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *pDVar2;
  
  operator_delete(this->Buckets,(ulong)this->NumBuckets * 0x50,8);
  uVar1 = other->NumBuckets;
  this->NumBuckets = uVar1;
  if ((ulong)uVar1 != 0) {
    pDVar2 = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)
             operator_new((ulong)uVar1 * 0x50,8);
    this->Buckets = pDVar2;
    DenseMapBase<llvm::DenseMap<unsigned_long,llvm::RelocAddrEntry,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::RelocAddrEntry>>,unsigned_long,llvm::RelocAddrEntry,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::RelocAddrEntry>>
    ::
    copyFrom<llvm::DenseMap<unsigned_long,llvm::RelocAddrEntry,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::RelocAddrEntry>>>
              ((DenseMapBase<llvm::DenseMap<unsigned_long,llvm::RelocAddrEntry,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::RelocAddrEntry>>,unsigned_long,llvm::RelocAddrEntry,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::RelocAddrEntry>>
                *)this,(DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>,_unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
                        *)other);
    return;
  }
  this->Buckets = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  this->NumEntries = 0;
  this->NumTombstones = 0;
  return;
}

Assistant:

void copyFrom(const DenseMap& other) {
    this->destroyAll();
    deallocate_buffer(Buckets, sizeof(BucketT) * NumBuckets, alignof(BucketT));
    if (allocateBuckets(other.NumBuckets)) {
      this->BaseT::copyFrom(other);
    } else {
      NumEntries = 0;
      NumTombstones = 0;
    }
  }